

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

void __thiscall Assimp::OptimizeMeshesProcess::Execute(OptimizeMeshesProcess *this,aiScene *pScene)

{
  uint uVar1;
  Logger *pLVar2;
  reference pvVar3;
  size_type sVar4;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_90;
  aiMesh **local_70;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48;
  uint local_24;
  uint local_20;
  uint n;
  uint i;
  uint num_old;
  aiScene *pScene_local;
  OptimizeMeshesProcess *this_local;
  
  n = pScene->mNumMeshes;
  _i = pScene;
  pScene_local = (aiScene *)this;
  if (n < 2) {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"Skipping OptimizeMeshesProcess");
  }
  else {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"OptimizeMeshesProcess begin");
    this->mScene = _i;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(&this->merge_list,0);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(&this->output,0);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->merge_list,(ulong)_i->mNumMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&this->output,(ulong)_i->mNumMeshes);
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(&this->meshes,(ulong)_i->mNumMeshes);
    FindInstancedMeshes(this,_i->mRootNode);
    if (this->max_verts == 0xdeadbeef) {
      this->max_verts = 0xffffffff;
    }
    local_24 = 0;
    for (local_20 = 0; local_20 < _i->mNumMeshes; local_20 = local_20 + 1) {
      uVar1 = GetMeshVFormatUnique(_i->mMeshes[local_20]);
      pvVar3 = std::
               vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               ::operator[](&this->meshes,(ulong)local_20);
      pvVar3->vertex_format = uVar1;
      pvVar3 = std::
               vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               ::operator[](&this->meshes,(ulong)local_20);
      if (1 < pvVar3->instance_cnt) {
        pvVar3 = std::
                 vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                 ::operator[](&this->meshes,(ulong)local_20);
        uVar1 = local_24;
        if (pvVar3->output_id == 0xffffffff) {
          local_24 = local_24 + 1;
          pvVar3 = std::
                   vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                   ::operator[](&this->meshes,(ulong)local_20);
          pvVar3->output_id = uVar1;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    (&this->output,this->mScene->mMeshes + local_20);
        }
      }
    }
    ProcessNode(this,_i->mRootNode);
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->output);
    if (sVar4 == 0) {
      local_5d = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,
                 "OptimizeMeshes: No meshes remaining; there\'s definitely something wrong",
                 &local_49);
      DeadlyImportError::DeadlyImportError(this_00,&local_48);
      local_5d = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(&this->meshes,0);
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->output);
    if (n < sVar4) {
      __assert_fail("output.size() <= num_old",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeMeshes.cpp"
                    ,0x94,"virtual void Assimp::OptimizeMeshesProcess::Execute(aiScene *)");
    }
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->output);
    this->mScene->mNumMeshes = (uint)sVar4;
    local_68._M_current =
         (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->output);
    local_70 = (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->output);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              (local_68,(__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                         )local_70,this->mScene->mMeshes);
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->output);
    if (sVar4 == n) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"OptimizeMeshesProcess finished");
    }
    else {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[47]>
                (&local_208,(char (*) [47])"OptimizeMeshesProcess finished. Input meshes: ");
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_208,&n);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [18])", Output meshes: ");
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar5,&_i->mNumMeshes);
      Formatter::basic_formatter::operator_cast_to_string(&local_90,this_01);
      Logger::debug(pLVar2,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_208);
    }
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::Execute( aiScene* pScene)
{
    const unsigned int num_old = pScene->mNumMeshes;
    if (num_old <= 1) {
        ASSIMP_LOG_DEBUG("Skipping OptimizeMeshesProcess");
        return;
    }

    ASSIMP_LOG_DEBUG("OptimizeMeshesProcess begin");
    mScene = pScene;

    // need to clear persistent members from previous runs
    merge_list.resize( 0 );
    output.resize( 0 );

    // ensure we have the right sizes
    merge_list.reserve(pScene->mNumMeshes);
    output.reserve(pScene->mNumMeshes);

    // Prepare lookup tables
    meshes.resize(pScene->mNumMeshes);
    FindInstancedMeshes(pScene->mRootNode);
    if( max_verts == DeadBeef ) /* undo the magic hack */
        max_verts = NotSet;

    // ... instanced meshes are immediately processed and added to the output list
    for (unsigned int i = 0, n = 0; i < pScene->mNumMeshes;++i) {
        meshes[i].vertex_format = GetMeshVFormatUnique(pScene->mMeshes[i]);

        if (meshes[i].instance_cnt > 1 && meshes[i].output_id == NotSet ) {
            meshes[i].output_id = n++;
            output.push_back(mScene->mMeshes[i]);
        }
    }

    // and process all nodes in the scenegraph recursively
    ProcessNode(pScene->mRootNode);
    if (!output.size()) {
        throw DeadlyImportError("OptimizeMeshes: No meshes remaining; there's definitely something wrong");
    }

    meshes.resize( 0 );
    ai_assert(output.size() <= num_old);

    mScene->mNumMeshes = static_cast<unsigned int>(output.size());
    std::copy(output.begin(),output.end(),mScene->mMeshes);

    if (output.size() != num_old) {
        ASSIMP_LOG_DEBUG_F("OptimizeMeshesProcess finished. Input meshes: ", num_old, ", Output meshes: ", pScene->mNumMeshes);
    } else {
        ASSIMP_LOG_DEBUG( "OptimizeMeshesProcess finished" );
    }
}